

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O2

void __thiscall Js::ScriptContext::ClearDynamicProfileList(ScriptContext *this)

{
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_00;
  
  this_00 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
  if (this_00 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Reset(this_00);
    (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr =
         (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ClearDynamicProfileList()
        {
            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Reset();
                this->Cache()->profileInfoList = nullptr;
            }
        }